

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

unsigned_long * __thiscall
google::protobuf::Reflection::GetRaw<unsigned_long>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  long lVar1;
  uint32_t uVar2;
  LogMessage *pLVar3;
  LogFinisher local_62;
  LogFinisher local_61;
  LogMessage local_60;
  
  lVar1 = *(long *)(field + 0x28);
  if (lVar1 != 0 && ((byte)field[1] & 0x10) != 0) {
    if (*(int *)(lVar1 + 4) == 1) {
      if ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0) goto LAB_0039c25a;
      if ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0) {
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                   ,0x5b7);
        pLVar3 = internal::LogMessage::operator<<
                           (&local_60,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
        internal::LogFinisher::operator=(&local_61,pLVar3);
        internal::LogMessage::~LogMessage(&local_60);
      }
    }
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) >> 3)
                              * 0x33333334 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 4)) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                 ,0x5c5);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: !schema_.InRealOneof(field) || HasOneofField(message, field): "
                         );
      pLVar3 = internal::LogMessage::operator<<(pLVar3,"Field = ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)(*(long *)(field + 8) + 0x20));
      internal::LogFinisher::operator=(&local_62,pLVar3);
      internal::LogMessage::~LogMessage(&local_60);
    }
  }
LAB_0039c25a:
  uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  return (unsigned_long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();
  return internal::GetConstRefAtOffset<Type>(message,
                                             schema_.GetFieldOffset(field));
}